

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O1

void * __thiscall QFontEngine::harfbuzzFace(QFontEngine *this)

{
  hb_face_t *phVar1;
  
  phVar1 = hb_qt_face_get_for_engine(this);
  return phVar1;
}

Assistant:

void *QFontEngine::harfbuzzFace() const
{
    Q_ASSERT(type() != QFontEngine::Multi);
#if QT_CONFIG(harfbuzz)
     return hb_qt_face_get_for_engine(const_cast<QFontEngine *>(this));
#else
    return nullptr;
#endif
}